

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalQuantity::switchStorage(DecimalQuantity *this)

{
  int local_2c;
  uint64_t uStack_28;
  int i_1;
  uint64_t bcdLong_1;
  ulong uStack_18;
  int i;
  uint64_t bcdLong;
  DecimalQuantity *this_local;
  
  if ((this->usingBytes & 1U) == 0) {
    uStack_28 = (this->fBCD).bcdLong;
    ensureCapacity(this);
    for (local_2c = 0; local_2c < this->precision; local_2c = local_2c + 1) {
      (this->fBCD).bcdBytes.ptr[local_2c] = (byte)uStack_28 & 0xf;
      uStack_28 = uStack_28 >> 4;
    }
  }
  else {
    uStack_18 = 0;
    bcdLong_1._4_4_ = this->precision;
    while (bcdLong_1._4_4_ = bcdLong_1._4_4_ + -1, -1 < bcdLong_1._4_4_) {
      uStack_18 = (long)(this->fBCD).bcdBytes.ptr[bcdLong_1._4_4_] | uStack_18 << 4;
    }
    uprv_free_63((this->fBCD).bcdBytes.ptr);
    (this->fBCD).bcdBytes.ptr = (int8_t *)0x0;
    (this->fBCD).bcdLong = uStack_18;
    this->usingBytes = false;
  }
  return;
}

Assistant:

void DecimalQuantity::switchStorage() {
    if (usingBytes) {
        // Change from bytes to long
        uint64_t bcdLong = 0L;
        for (int i = precision - 1; i >= 0; i--) {
            bcdLong <<= 4;
            bcdLong |= fBCD.bcdBytes.ptr[i];
        }
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = nullptr;
        fBCD.bcdLong = bcdLong;
        usingBytes = false;
    } else {
        // Change from long to bytes
        // Copy the long into a local variable since it will get munged when we allocate the bytes
        uint64_t bcdLong = fBCD.bcdLong;
        ensureCapacity();
        for (int i = 0; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(bcdLong & 0xf);
            bcdLong >>= 4;
        }
        U_ASSERT(usingBytes);
    }
}